

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeReal(Vdbe *v,char *z,int negateFlag,int iMem)

{
  int length;
  char *zP4;
  char *zV;
  double value;
  int iMem_local;
  int negateFlag_local;
  char *z_local;
  Vdbe *v_local;
  
  if (z != (char *)0x0) {
    value._0_4_ = iMem;
    value._4_4_ = negateFlag;
    _iMem_local = z;
    z_local = (char *)v;
    length = sqlite3Strlen30(z);
    sqlite3AtoF(z,(double *)&zV,length,'\x01');
    if (value._4_4_ != 0) {
      zV = (char *)((ulong)zV ^ 0x8000000000000000);
    }
    zP4 = dup8bytes((Vdbe *)z_local,(char *)&zV);
    sqlite3VdbeAddOp4((Vdbe *)z_local,0x82,0,value._0_4_,0,zP4,-0xc);
  }
  return;
}

Assistant:

static void codeReal(Vdbe *v, const char *z, int negateFlag, int iMem){
  if( ALWAYS(z!=0) ){
    double value;
    char *zV;
    sqlite3AtoF(z, &value, sqlite3Strlen30(z), SQLITE_UTF8);
    assert( !sqlite3IsNaN(value) ); /* The new AtoF never returns NaN */
    if( negateFlag ) value = -value;
    zV = dup8bytes(v, (char*)&value);
    sqlite3VdbeAddOp4(v, OP_Real, 0, iMem, 0, zV, P4_REAL);
  }
}